

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

void __thiscall ON_PolyCurve::DestroyRuntimeCache(ON_PolyCurve *this,bool bDelete)

{
  ON_PolyCurve *pOVar1;
  long lVar2;
  long lVar3;
  
  ON_Curve::DestroyRuntimeCache(&this->super_ON_Curve,bDelete);
  lVar2 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pOVar1 = (ON_PolyCurve *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar3];
      if (pOVar1 != this && pOVar1 != (ON_PolyCurve *)0x0) {
        (*(pOVar1->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                  (pOVar1,(ulong)bDelete);
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

void ON_PolyCurve::DestroyRuntimeCache( bool bDelete )
{
  ON_Curve::DestroyRuntimeCache(bDelete);
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Curve* segment_curve = m_segment[i];
    if ( 0 != segment_curve && this != segment_curve )
      segment_curve->DestroyRuntimeCache(bDelete);
  }
}